

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O1

void __thiscall MT32Emu::LA32WaveGenerator::generateNextSquareWaveLogSample(LA32WaveGenerator *this)

{
  int iVar1;
  Tables *pTVar2;
  Bit16u BVar3;
  uint uVar4;
  
  iVar1 = 0;
  switch(this->phase) {
  case POSITIVE_RISING_SINE_SEGMENT:
  case NEGATIVE_FALLING_SINE_SEGMENT:
    pTVar2 = Tables::getInstance();
    uVar4 = this->squareWavePosition;
    break;
  default:
    goto switchD_00120020_caseD_1;
  case POSITIVE_FALLING_SINE_SEGMENT:
  case NEGATIVE_RISING_SINE_SEGMENT:
    pTVar2 = Tables::getInstance();
    uVar4 = ~this->squareWavePosition;
  }
  iVar1 = (uint)pTVar2->logsin9[uVar4 >> 9 & 0x1ff] << 2;
switchD_00120020_caseD_1:
  uVar4 = 0;
  if (this->cutoffVal < 0x2000000) {
    uVar4 = -(this->cutoffVal + 0xfe000000) >> 9;
  }
  uVar4 = (this->amp >> 10) + iVar1 + uVar4;
  BVar3 = (Bit16u)uVar4;
  if (0xfffe < uVar4) {
    BVar3 = 0xffff;
  }
  (this->squareLogSample).logValue = BVar3;
  (this->squareLogSample).sign = (uint)(2 < (int)this->phase);
  return;
}

Assistant:

void LA32WaveGenerator::generateNextSquareWaveLogSample() {
	Bit32u logSampleValue;
	switch (phase) {
		case POSITIVE_RISING_SINE_SEGMENT:
		case NEGATIVE_FALLING_SINE_SEGMENT:
			logSampleValue = Tables::getInstance().logsin9[(squareWavePosition >> 9) & 511];
			break;
		case POSITIVE_FALLING_SINE_SEGMENT:
		case NEGATIVE_RISING_SINE_SEGMENT:
			logSampleValue = Tables::getInstance().logsin9[~(squareWavePosition >> 9) & 511];
			break;
		case POSITIVE_LINEAR_SEGMENT:
		case NEGATIVE_LINEAR_SEGMENT:
		default:
			logSampleValue = 0;
			break;
	}
	logSampleValue <<= 2;
	logSampleValue += amp >> 10;
	if (cutoffVal < MIDDLE_CUTOFF_VALUE) {
		logSampleValue += (MIDDLE_CUTOFF_VALUE - cutoffVal) >> 9;
	}

	squareLogSample.logValue = logSampleValue < 65536 ? Bit16u(logSampleValue) : 65535;
	squareLogSample.sign = phase < NEGATIVE_FALLING_SINE_SEGMENT ? LogSample::POSITIVE : LogSample::NEGATIVE;
}